

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xpath_lang(lyxp_set **args,uint16_t UNUSED_arg_count,lyd_node *cur_node,lys_module *param_4,
              lyxp_set *set,int options)

{
  lyxp_node_type lVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  lyd_node *root_00;
  int local_5c;
  lyd_attr *plStack_58;
  int i;
  lyd_attr *attr;
  lyd_node *root;
  lyd_node *node;
  int options_local;
  lyxp_set *set_local;
  lys_module *local_mod_local;
  lyd_node *cur_node_local;
  uint16_t UNUSED_arg_count_local;
  lyxp_set **args_local;
  
  plStack_58 = (lyd_attr *)0x0;
  iVar2 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  if (iVar2 == 0) {
    if (set->type == LYXP_SET_EMPTY) {
      set_fill_boolean(set,0);
      args_local._4_4_ = 0;
    }
    else if (set->type == LYXP_SET_NODE_SET) {
      lVar1 = ((set->val).nodes)->type;
      if (lVar1 - LYXP_NODE_ELEM < 2) {
        root = ((set->val).nodes)->node;
      }
      else {
        if (lVar1 != LYXP_NODE_ATTR) {
          set_fill_boolean(set,0);
          return 0;
        }
        root_00 = moveto_get_root(cur_node,options,(lyxp_node_type *)0x0);
        root = lyd_attr_parent(root_00,((set->val).attrs)->attr);
      }
      for (; root != (lyd_node *)0x0; root = root->parent) {
        plStack_58 = root->attr;
        while ((plStack_58 != (lyd_attr *)0x0 &&
               (((plStack_58->name == (char *)0x0 ||
                 (iVar2 = strcmp(plStack_58->name,"lang"), iVar2 != 0)) ||
                (iVar2 = strcmp(plStack_58->annotation->module->name,"xml"), iVar2 != 0))))) {
          plStack_58 = plStack_58->next;
        }
        if (plStack_58 != (lyd_attr *)0x0) break;
      }
      if (plStack_58 == (lyd_attr *)0x0) {
        set_fill_boolean(set,0);
      }
      else {
        for (local_5c = 0; *(char *)((long)&(((*args)->val).nodes)->node + (long)local_5c) != '\0';
            local_5c = local_5c + 1) {
          iVar2 = tolower((int)*(char *)((long)&(((*args)->val).nodes)->node + (long)local_5c));
          iVar3 = tolower((int)plStack_58->value_str[local_5c]);
          if (iVar2 != iVar3) {
            set_fill_boolean(set,0);
            break;
          }
        }
        if (*(char *)((long)&(((*args)->val).nodes)->node + (long)local_5c) == '\0') {
          if ((plStack_58->value_str[local_5c] == '\0') || (plStack_58->value_str[local_5c] == '-'))
          {
            set_fill_boolean(set,1);
          }
          else {
            set_fill_boolean(set,0);
          }
        }
      }
      args_local._4_4_ = 0;
    }
    else {
      pcVar4 = print_set_type(set);
      ly_vlog(LYE_XPATH_INCTX,LY_VLOG_NONE,(void *)0x0,pcVar4,"lang(string)");
      args_local._4_4_ = -1;
    }
  }
  else {
    args_local._4_4_ = -1;
  }
  return args_local._4_4_;
}

Assistant:

static int
xpath_lang(struct lyxp_set **args, uint16_t UNUSED(arg_count), struct lyd_node *cur_node, struct lys_module *local_mod,
           struct lyxp_set *set, int options)
{
    const struct lyd_node *node, *root;
    struct lyd_attr *attr = NULL;
    int i;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    if (set->type == LYXP_SET_EMPTY) {
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }
    if (set->type != LYXP_SET_NODE_SET) {
        LOGVAL(LYE_XPATH_INCTX, LY_VLOG_NONE, NULL, print_set_type(set), "lang(string)");
        return -1;
    }

    switch (set->val.nodes[0].type) {
    case LYXP_NODE_ELEM:
    case LYXP_NODE_TEXT:
        node = set->val.nodes[0].node;
        break;
    case LYXP_NODE_ATTR:
        root = moveto_get_root(cur_node, options, NULL);
        node = lyd_attr_parent(root, set->val.attrs[0].attr);
        break;
    default:
        /* nothing to do with roots */
        set_fill_boolean(set, 0);
        return EXIT_SUCCESS;
    }

    /* find lang attribute */
    for (; node; node = node->parent) {
        for (attr = node->attr; attr; attr = attr->next) {
            if (attr->name && !strcmp(attr->name, "lang") && !strcmp(attr->annotation->module->name, "xml")) {
                break;
            }
        }

        if (attr) {
            break;
        }
    }

    /* compare languages */
    if (!attr) {
        set_fill_boolean(set, 0);
    } else {
        for (i = 0; args[0]->val.str[i]; ++i) {
            if (tolower(args[0]->val.str[i]) != tolower(attr->value_str[i])) {
                set_fill_boolean(set, 0);
                break;
            }
        }
        if (!args[0]->val.str[i]) {
            if (!attr->value_str[i] || (attr->value_str[i] == '-')) {
                set_fill_boolean(set, 1);
            } else {
                set_fill_boolean(set, 0);
            }
        }
    }

    return EXIT_SUCCESS;
}